

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O3

int gpt2_decode(gpt2_model *model,ggml_gallocr_t allocr,gpt2_batch batch,int n_threads,
               vector<float,_std::allocator<float>_> *logits)

{
  int iVar1;
  pointer pgVar2;
  void *pvVar3;
  int32_t iVar4;
  gpt2_pos *pgVar5;
  int8_t *piVar6;
  gpt2_model *pgVar7;
  id *piVar8;
  vector<float,_std::allocator<float>_> *pvVar9;
  size_type sVar10;
  char cVar11;
  int iVar12;
  ggml_cgraph *pgVar13;
  undefined8 uVar14;
  uint uVar15;
  _Base_ptr p_Var16;
  ulong uVar17;
  long lVar18;
  gpt2_seq_id *__v;
  _Base_ptr p_Var19;
  long lVar20;
  long lVar21;
  _Base_ptr p_Var22;
  long lVar23;
  allocator_type local_89;
  gpt2_model *local_88;
  id *local_80;
  vector<float,_std::allocator<float>_> *local_78;
  int local_6c;
  vector<float,_std::allocator<float>_> local_68;
  size_type local_50;
  ggml_cgraph *local_48;
  float *local_40;
  ggml_gallocr_t local_38;
  
  iVar4 = batch.n_tokens;
  pgVar5 = batch.pos;
  lVar21 = (long)batch.n_tokens;
  local_78 = logits;
  if (lVar21 == 0) {
    printf("%s: n_tokens == 0","gpt2_decode");
    iVar12 = -1;
  }
  else {
    local_80 = batch.token;
    local_40 = batch.embd;
    local_6c = n_threads;
    if ((batch.embd != (float *)0x0) != (batch.token == (id *)0x0)) {
      uVar14 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/gpt-2/main-batched.cpp"
                          ,0x376,"GGML_ASSERT(%s) failed",
                          "(!batch.token && batch.embd) || (batch.token && !batch.embd)");
      pvVar3 = (void *)CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_68.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      _Unwind_Resume(uVar14);
    }
    local_50 = (size_type)(model->hparams).n_vocab;
    local_38 = allocr;
    if (0 < batch.n_tokens) {
      lVar18 = 0;
      __v = batch.seq_id;
      do {
        pgVar2 = (model->kv_cache).cells.
                 super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
                 super__Vector_impl_data._M_start + ((model->kv_cache).head + (int)lVar18);
        pgVar2->pos = pgVar5[lVar18];
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &pgVar2->seq_id,__v);
        lVar18 = lVar18 + 1;
        __v = __v + 1;
      } while (lVar21 != lVar18);
    }
    (model->kv_cache).n = (model->kv_cache).head + iVar4;
    pgVar13 = gpt2_graph(model,&batch,false);
    ggml_gallocr_alloc_graph(local_38,pgVar13);
    piVar8 = local_80;
    local_88 = model;
    local_48 = pgVar13;
    if (local_80 == (id *)0x0) {
      uVar14 = ggml_graph_get_tensor(pgVar13,"embd");
      iVar12 = (model->hparams).n_embd;
      lVar18 = ggml_element_size(uVar14);
      ggml_backend_tensor_set(uVar14,local_40,0,(long)iVar12 * lVar18 * lVar21);
    }
    else {
      uVar14 = ggml_graph_get_tensor(pgVar13,"inp_tokens");
      lVar18 = ggml_element_size(uVar14);
      ggml_backend_tensor_set(uVar14,piVar8,0,lVar18 * lVar21);
      uVar14 = ggml_graph_get_tensor(pgVar13,"position");
      pgVar5 = batch.pos;
      if (0 < iVar4) {
        lVar18 = 0;
        do {
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start._0_4_ = *(undefined4 *)((long)pgVar5 + lVar18);
          ggml_backend_tensor_set(uVar14,&local_68,lVar18,4);
          lVar18 = lVar18 + 4;
        } while (lVar21 * 4 - lVar18 != 0);
      }
    }
    local_80 = (id *)ggml_graph_get_tensor(local_48,"KQ_mask");
    uVar15 = (local_88->kv_cache).n;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_68,(long)(int)(uVar15 * iVar4),&local_89);
    if (0 < iVar4) {
      pgVar2 = (local_88->kv_cache).cells.
               super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        if (0 < (int)uVar15) {
          iVar12 = batch.pos[lVar18];
          iVar1 = batch.seq_id[lVar18];
          uVar17 = 0;
          do {
            p_Var16 = *(_Base_ptr *)((long)&pgVar2[uVar17].seq_id._M_t._M_impl + 0x10);
            if (p_Var16 == (_Base_ptr)0x0) {
LAB_0010a8ed:
              *(undefined4 *)
               (lVar18 * (ulong)uVar15 * 4 +
                CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) + uVar17 * 4) = 0xff800000;
            }
            else {
              p_Var19 = (_Base_ptr)((long)&pgVar2[uVar17].seq_id._M_t._M_impl + 8);
              p_Var22 = p_Var19;
              do {
                if (iVar1 <= (int)p_Var16[1]._M_color) {
                  p_Var22 = p_Var16;
                }
                p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < iVar1];
              } while (p_Var16 != (_Base_ptr)0x0);
              if (((p_Var22 == p_Var19) || (iVar1 < (int)p_Var22[1]._M_color)) ||
                 (iVar12 < pgVar2[uVar17].pos)) goto LAB_0010a8ed;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar15);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar21);
    }
    ggml_backend_tensor_set
              (local_80,CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_),0,
               (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_));
    pgVar13 = local_48;
    pgVar7 = local_88;
    pvVar3 = (void *)CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_68.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3)
      ;
    }
    cVar11 = ggml_backend_is_cpu(pgVar7->backend);
    if (cVar11 != '\0') {
      ggml_backend_cpu_set_n_threads(pgVar7->backend,local_6c);
    }
    ggml_backend_graph_compute(pgVar7->backend,pgVar13);
    uVar14 = ggml_graph_node(pgVar13,0xffffffff);
    sVar10 = local_50;
    pvVar9 = local_78;
    piVar6 = batch.logits;
    iVar12 = (int)local_50;
    if (batch.logits == (int8_t *)0x0) {
      std::vector<float,_std::allocator<float>_>::resize(local_78,local_50);
      ggml_backend_tensor_get
                (uVar14,(pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start,(long)((iVar4 + -1) * iVar12) << 2,
                 sVar10 << 2);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize(local_78,(long)(iVar12 * iVar4));
      if (0 < iVar4) {
        lVar18 = sVar10 * 4;
        lVar20 = 0;
        lVar23 = 0;
        do {
          if (piVar6[lVar23] != '\0') {
            ggml_backend_tensor_get
                      (uVar14,(long)(local_78->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar20,lVar20,lVar18)
            ;
          }
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + lVar18;
        } while (lVar21 != lVar23);
      }
    }
    uVar15 = (local_88->kv_cache).head + iVar4;
    (local_88->kv_cache).head = uVar15;
    iVar12 = 0;
    if ((local_88->kv_cache).size <= uVar15) {
      printf("%s: cache.head >= cache.size\n","gpt2_decode");
      iVar12 = -2;
    }
  }
  return iVar12;
}

Assistant:

int gpt2_decode(
        struct gpt2_model &  model,
        ggml_gallocr_t       allocr,
        struct gpt2_batch    batch,
        int                  n_threads,
        std::vector<float> & logits) {
    const int32_t n_tokens = batch.n_tokens;
    const auto &  hparams  = model.hparams;
    const int     n_vocab  = hparams.n_vocab;

    if (n_tokens == 0) {
        printf("%s: n_tokens == 0", __func__);
        return -1;
    }

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd));

    auto & cache = model.kv_cache;

    for (int i = 0; i < n_tokens; i++) {
        cache.cells[cache.head + i].pos = batch.pos[i];
        cache.cells[cache.head + i].seq_id.insert(batch.seq_id[i]);
    }

    cache.n = cache.head + n_tokens;

    struct ggml_cgraph * gf = gpt2_graph(model, batch, false);

    // allocate tensors
    ggml_gallocr_alloc_graph(allocr, gf);

    // set the graph inputs
    if (batch.token) {
        struct ggml_tensor * inp_tokens = ggml_graph_get_tensor(gf, "inp_tokens");
        ggml_backend_tensor_set(inp_tokens, batch.token, 0, n_tokens*ggml_element_size(inp_tokens));

        struct ggml_tensor * position = ggml_graph_get_tensor(gf, "position");
        for (int i = 0; i < n_tokens; ++i) {
            int32_t v = batch.pos[i];
            ggml_backend_tensor_set(position, &v, i*sizeof(int32_t), sizeof(v));
        }
    } else {
        struct ggml_tensor * embd = ggml_graph_get_tensor(gf, "embd");
        ggml_backend_tensor_set(embd, batch.embd, 0, n_tokens * hparams.n_embd * ggml_element_size(embd));
    }

    {
        struct ggml_tensor * KQ_mask = ggml_graph_get_tensor(gf, "KQ_mask");
        const auto & kv_cache = model.kv_cache;
        const int32_t n_tokens = batch.n_tokens;
        const int32_t n_kv     = kv_cache.n;

        std::vector<float> data_buf(n_kv*n_tokens);
        const float neg_inf_v = -INFINITY;

        for (int h = 0; h < 1; ++h) {
            int h_offset = h*(n_kv*n_tokens);
            for (int j = 0; j < n_tokens; ++j) {
                const gpt2_pos    pos    = batch.pos[j];
                const gpt2_seq_id seq_id = batch.seq_id[j];

                for (int i = 0; i < n_kv; ++i) {
                    if (!kv_cache.cells[i].has_seq_id(seq_id) || kv_cache.cells[i].pos > pos) {
                        data_buf[h_offset + j*n_kv + i] = neg_inf_v;
                    }
                }
            }
        }

        ggml_backend_tensor_set(KQ_mask, data_buf.data(), 0, data_buf.size() * sizeof(float));
    }

    // run the computation
    if (ggml_backend_is_cpu(model.backend)) {
        ggml_backend_cpu_set_n_threads(model.backend, n_threads);
    }
    ggml_backend_graph_compute(model.backend, gf);

    //if (n_past%100 == 0) {
    //    ggml_graph_print   (&gf);
    //    ggml_graph_dump_dot(&gf, NULL, "gpt-2.dot");
    //}

    // in this case, the output tensor is the last one in the graph
    struct ggml_tensor * inpL = ggml_graph_node(gf, -1);

    if (batch.logits) {
        // return logits for all tokens
        logits.resize(n_vocab*n_tokens);
        for (int32_t i = 0; i < n_tokens; i++) {
            if (batch.logits[i] == 0) {
                continue;
            }
            ggml_backend_tensor_get(inpL, logits.data() + n_vocab*i, n_vocab*i*sizeof(float), sizeof(float)*n_vocab);
        }
    } else {
        // return result just for the last token
        logits.resize(n_vocab);
        ggml_backend_tensor_get(inpL, logits.data(), (n_vocab*(n_tokens-1))*sizeof(float), sizeof(float)*n_vocab);
    }

    // update the kv ring buffer
    cache.head += n_tokens;

    // ensure kv cache head points to a valid index.
    if (cache.head >= cache.size) {
        printf("%s: cache.head >= cache.size\n", __func__);
        return -2;
    }

    return 0;
}